

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O1

REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents)

{
  REF_AGENT_STRUCT *pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  uint uVar3;
  bool bVar4;
  REF_STATUS RVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  REF_INT nsend;
  REF_INT *unaff_R12;
  REF_MPI ref_mpi;
  long lVar11;
  long lVar12;
  long lVar13;
  REF_INT local_78;
  int local_74;
  REF_INT dest;
  REF_INT nrecv;
  void *local_68;
  void *local_60;
  REF_MPI local_58;
  void *local_50;
  REF_DBL *recv_dbl;
  REF_GLOB *recv_glob;
  REF_INT *recv_int;
  
  ref_mpi = ref_agents->ref_mpi;
  if (ref_agents->max < 1) {
    lVar13 = 0;
    uVar9 = 0;
  }
  else {
    lVar11 = 0;
    unaff_R12 = &dest;
    lVar13 = 0;
    uVar9 = 0;
    do {
      if (*(int *)((long)ref_agents->agent->xyz + lVar11 + -0x30) != 0) {
        RVar5 = ref_agents_dest(ref_agents,(REF_INT)lVar13,unaff_R12);
        if (RVar5 != 0) {
          local_78 = (REF_INT)lVar13;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x115,"ref_agents_migrate",1,"dest");
          return 1;
        }
        uVar9 = uVar9 + (ref_mpi->id != dest);
      }
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x68;
    } while (lVar13 < ref_agents->max);
  }
  local_78 = (REF_INT)lVar13;
  if ((int)uVar9 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x11d,
           "ref_agents_migrate");
    uVar7 = 1;
  }
  else {
    unaff_R12 = (REF_INT *)malloc((ulong)uVar9 * 4);
    if (unaff_R12 == (REF_INT *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
             0x11d,"ref_agents_migrate");
      uVar7 = 2;
      unaff_R12 = (REF_INT *)0x0;
    }
    else {
      bVar4 = true;
      if (uVar9 != 0) {
        memset(unaff_R12,0xff,(ulong)uVar9 << 2);
      }
      uVar7 = 1;
    }
  }
  if (bVar4) {
    if ((int)uVar9 < 0) {
      bVar4 = false;
      iVar6 = printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                     ,0x11e,"ref_agents_migrate");
      local_50 = (void *)CONCAT44(extraout_var,iVar6);
      uVar7 = 1;
    }
    else {
      uVar3 = uVar9 * 6;
      local_50 = malloc((ulong)uVar3 << 2);
      if (local_50 == (void *)0x0) {
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x11e,"ref_agents_migrate");
        uVar7 = 2;
        local_50 = (void *)0x0;
      }
      else {
        bVar4 = true;
        if (uVar9 != 0) {
          uVar8 = 1;
          if (1 < (int)uVar3) {
            uVar8 = (ulong)uVar3;
          }
          memset(local_50,0xff,uVar8 << 2);
        }
      }
    }
    if (bVar4) {
      if ((int)uVar9 < 0) {
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x11f,"ref_agents_migrate");
        uVar7 = 1;
      }
      else {
        local_60 = malloc((ulong)uVar9 * 8);
        if (local_60 == (void *)0x0) {
          local_60 = (void *)0x0;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x11f,"ref_agents_migrate");
          uVar7 = 2;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (uVar9 != 0) {
            memset(local_60,0xff,(ulong)uVar9 << 3);
          }
        }
      }
      if (bVar4) {
        if ((int)uVar9 < 0) {
          bVar4 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x120,"ref_agents_migrate");
          uVar7 = 1;
        }
        else {
          uVar3 = uVar9 * 7;
          local_68 = malloc((ulong)uVar3 << 3);
          if (local_68 == (void *)0x0) {
            local_68 = (void *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                   ,0x120,"ref_agents_migrate");
            uVar7 = 2;
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (uVar9 != 0) {
              uVar8 = 1;
              if (1 < (int)uVar3) {
                uVar8 = (ulong)uVar3;
              }
              memset(local_68,0,uVar8 << 3);
            }
          }
        }
        if (bVar4) {
          if (ref_agents->max < 1) {
            lVar13 = 0;
            nsend = 0;
          }
          else {
            lVar11 = 0x30;
            lVar12 = 0x48;
            lVar13 = 0;
            local_74 = 0;
            local_58 = ref_mpi;
            do {
              ref_mpi = local_58;
              if (ref_agents->agent[lVar13].mode != REF_AGENT_UNUSED) {
                uVar9 = ref_agents_dest(ref_agents,(REF_INT)lVar13,&dest);
                ref_mpi = local_58;
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                         ,0x123,"ref_agents_migrate",(ulong)uVar9,"dest");
                  return uVar9;
                }
                if (local_58->id != dest) {
                  unaff_R12[local_74] = dest;
                  pRVar1 = ref_agents->agent;
                  lVar10 = (long)(local_74 * 6);
                  *(REF_AGENT_MODE *)((long)local_50 + lVar10 * 4) = pRVar1[lVar13].mode;
                  *(REF_INT *)((long)local_50 + (long)(local_74 * 6 + 1) * 4) = pRVar1[lVar13].home;
                  *(REF_INT *)((long)local_50 + lVar10 * 4 + 8) = pRVar1[lVar13].node;
                  *(REF_INT *)((long)local_50 + lVar10 * 4 + 0xc) = pRVar1[lVar13].part;
                  *(REF_INT *)((long)local_50 + lVar10 * 4 + 0x10) = pRVar1[lVar13].seed;
                  *(REF_INT *)((long)local_50 + lVar10 * 4 + 0x14) = pRVar1[lVar13].step;
                  *(REF_GLOB *)((long)local_60 + (long)local_74 * 8) = pRVar1[lVar13].global;
                  lVar10 = 0;
                  do {
                    *(undefined8 *)((long)local_68 + lVar10 * 8 + (long)(local_74 * 7) * 8) =
                         *(undefined8 *)((long)pRVar1->xyz + lVar10 * 8 + lVar11 + -0x30);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar10 = 0;
                  do {
                    *(undefined8 *)((long)local_68 + (long)(local_74 * 7 + 3 + (int)lVar10) * 8) =
                         *(undefined8 *)((long)pRVar1->xyz + lVar10 * 8 + lVar12 + -0x30);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  uVar9 = ref_agents_remove(ref_agents,(REF_INT)lVar13);
                  if (uVar9 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                           ,0x134,"ref_agents_migrate",(ulong)uVar9,"poof");
                    return uVar9;
                  }
                  local_74 = local_74 + 1;
                }
              }
              lVar13 = lVar13 + 1;
              lVar11 = lVar11 + 0x68;
              lVar12 = lVar12 + 0x68;
              nsend = local_74;
            } while (lVar13 < ref_agents->max);
          }
          local_78 = (REF_INT)lVar13;
          uVar7 = ref_mpi_blindsend(ref_mpi,unaff_R12,local_50,6,nsend,&recv_int,&nrecv,1);
          if (uVar7 == 0) {
            uVar7 = ref_mpi_blindsend(ref_mpi,unaff_R12,local_60,1,nsend,&recv_glob,&nrecv,2);
            if (uVar7 == 0) {
              uVar7 = ref_mpi_blindsend(ref_mpi,unaff_R12,local_68,7,nsend,&recv_dbl,&nrecv,3);
              if (uVar7 == 0) {
                if (local_68 != (void *)0x0) {
                  free(local_68);
                }
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
                if (unaff_R12 != (REF_INT *)0x0) {
                  free(unaff_R12);
                }
                if (0 < nrecv) {
                  lVar13 = 0x18;
                  lVar11 = 0;
                  lVar12 = 0;
                  do {
                    uVar9 = ref_agents_new(ref_agents,&local_78);
                    if (uVar9 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                             ,0x149,"ref_agents_migrate",(ulong)uVar9,"new");
                      return uVar9;
                    }
                    pRVar2 = ref_agents->agent;
                    pRVar1 = pRVar2 + local_78;
                    pRVar1->mode = recv_int[lVar12 * 6];
                    pRVar1->home = recv_int[lVar12 * 6 + 1];
                    pRVar1->node = recv_int[lVar12 * 6 + 2];
                    pRVar1->part = recv_int[lVar12 * 6 + 3];
                    pRVar1->seed = recv_int[lVar12 * 6 + 4];
                    pRVar1->step = recv_int[lVar12 * 6 + 5];
                    pRVar1->global = recv_glob[lVar12];
                    lVar10 = 0;
                    do {
                      pRVar1->xyz[lVar10] = *(REF_DBL *)((long)recv_dbl + lVar10 * 8 + lVar11);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    lVar10 = 0;
                    do {
                      pRVar2[local_78].bary[lVar10] =
                           *(REF_DBL *)((long)recv_dbl + lVar10 * 8 + lVar13);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 4);
                    lVar12 = lVar12 + 1;
                    lVar11 = lVar11 + 0x38;
                    lVar13 = lVar13 + 0x38;
                  } while (lVar12 < nrecv);
                }
                if (recv_dbl != (REF_DBL *)0x0) {
                  free(recv_dbl);
                }
                if (recv_glob != (REF_GLOB *)0x0) {
                  free(recv_glob);
                }
                uVar7 = 0;
                if (recv_int != (REF_INT *)0x0) {
                  free(recv_int);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                       ,0x142,"ref_agents_migrate",(ulong)uVar7,"ds");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                     ,0x13f,"ref_agents_migrate",(ulong)uVar7,"is");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c"
                   ,0x13c,"ref_agents_migrate",(ulong)uVar7,"is");
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT i, id, nsend, nrecv, dest, rec;
  REF_INT n_ints, n_globs, n_dbls;
  REF_INT *destination, *send_int, *recv_int;
  REF_GLOB *send_glob, *recv_glob;
  REF_DBL *send_dbl, *recv_dbl;
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      nsend++;
    }
  }
  n_ints = 6;
  n_globs = 1;
  n_dbls = 7;
  ref_malloc_init(destination, nsend, REF_INT, REF_EMPTY);
  ref_malloc_init(send_int, nsend * n_ints, REF_INT, REF_EMPTY);
  ref_malloc_init(send_glob, nsend * n_globs, REF_GLOB, REF_EMPTY);
  ref_malloc_init(send_dbl, nsend * n_dbls, REF_DBL, 0.0);
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      destination[nsend] = dest;
      send_int[0 + nsend * n_ints] = (REF_INT)ref_agent_mode(ref_agents, id);
      send_int[1 + nsend * n_ints] = ref_agent_home(ref_agents, id);
      send_int[2 + nsend * n_ints] = ref_agent_node(ref_agents, id);
      send_int[3 + nsend * n_ints] = ref_agent_part(ref_agents, id);
      send_int[4 + nsend * n_ints] = ref_agent_seed(ref_agents, id);
      send_int[5 + nsend * n_ints] = ref_agent_step(ref_agents, id);

      send_glob[0 + nsend * n_globs] = ref_agent_global(ref_agents, id);

      for (i = 0; i < 3; i++)
        send_dbl[i + nsend * n_dbls] = ref_agent_xyz(ref_agents, i, id);
      for (i = 0; i < 4; i++)
        send_dbl[3 + i + nsend * n_dbls] = ref_agent_bary(ref_agents, i, id);

      RSS(ref_agents_remove(ref_agents, id), "poof");

      nsend++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_int, n_ints, nsend,
                        (void **)(&recv_int), &nrecv, REF_INT_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_glob, n_globs, nsend,
                        (void **)(&recv_glob), &nrecv, REF_GLOB_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_dbl, n_dbls, nsend,
                        (void **)(&recv_dbl), &nrecv, REF_DBL_TYPE),
      "ds");
  ref_free(send_dbl);
  ref_free(send_glob);
  ref_free(send_int);
  ref_free(destination);

  for (rec = 0; rec < nrecv; rec++) {
    RSS(ref_agents_new(ref_agents, &id), "new");
    ref_agent_mode(ref_agents, id) = (REF_AGENT_MODE)recv_int[0 + rec * n_ints];
    ref_agent_home(ref_agents, id) = recv_int[1 + rec * n_ints];
    ref_agent_node(ref_agents, id) = recv_int[2 + rec * n_ints];
    ref_agent_part(ref_agents, id) = recv_int[3 + rec * n_ints];
    ref_agent_seed(ref_agents, id) = recv_int[4 + rec * n_ints];
    ref_agent_step(ref_agents, id) = recv_int[5 + rec * n_ints];

    ref_agent_global(ref_agents, id) = recv_glob[0 + rec * n_globs];

    for (i = 0; i < 3; i++)
      ref_agent_xyz(ref_agents, i, id) = recv_dbl[i + rec * n_dbls];
    for (i = 0; i < 4; i++)
      ref_agent_bary(ref_agents, i, id) = recv_dbl[3 + i + rec * n_dbls];
  }

  ref_free(recv_dbl);
  ref_free(recv_glob);
  ref_free(recv_int);

  return REF_SUCCESS;
}